

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O0

int32_t pool_sync2(ProcPool *pool)

{
  _Bool _Var1;
  char *pcVar2;
  bool bVar3;
  int local_38;
  int local_30;
  uint local_2c;
  int32_t i;
  int exit_status;
  Process *p;
  int32_t idx;
  _Bool any_valid;
  ProcPool *pool_local;
  
  p._7_1_ = 0;
  _idx = pool;
  do {
    p._0_4_ = 0;
    while( true ) {
      if (_idx->max_num_procs < 0x10) {
        local_38 = _idx->max_num_procs;
      }
      else {
        local_38 = 0x10;
      }
      if (local_38 <= (int)p) break;
      _i = _idx->procs + (int)p;
      if ((_i->valid & 1U) != 0) {
        p._7_1_ = 1;
        if ((_idx->aborted & 1U) != 0) {
          if ((_i->valid & 1U) == 0) {
            __assert_fail("p->valid",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/proc.c"
                          ,0xb1,"int32_t pool_sync2(ProcPool *)");
          }
          kill(_i->pid,0xf);
        }
        local_2c = 0;
        _Var1 = proc_terminated(_i->pid,(int *)&local_2c);
        if (_Var1) {
          pcVar2 = "failed";
          if (local_2c == 0) {
            pcVar2 = "exited correctly";
          }
          printf("Process %d %s [status=%d]: ",(ulong)(uint)_i->pid,pcVar2,(ulong)local_2c);
          printf("(CMD");
          local_30 = 0;
          while( true ) {
            bVar3 = false;
            if (local_30 < 0xff) {
              bVar3 = _i->args[local_30] != (char *)0x0;
            }
            if (!bVar3) break;
            printf(" %s",_i->args[local_30]);
            local_30 = local_30 + 1;
          }
          printf(")\n");
          if (_idx->on_async_proc_exit != (_func_void_Process_ptr_int_void_ptr *)0x0) {
            (*_idx->on_async_proc_exit)(_i,local_2c,_i->user_handle);
          }
          proc_destroy(_i);
          return (int)p;
        }
      }
      p._0_4_ = (int)p + 1;
    }
    usleep(10000);
    if ((p._7_1_ & 1) == 0) {
      return -0x80000000;
    }
  } while( true );
}

Assistant:

static int32_t pool_sync2(ProcPool *pool) {
    bool any_valid = false;
    do {
        for (int32_t idx = 0; idx < MIN(pool->max_num_procs, PROC_POOL_SIZE);
             idx++) {
            Process *p = &pool->procs[idx];
            if (!p->valid) {
                continue;
            } else {
                any_valid = true;
            }

            if (pool->aborted) {
                assert(p->valid);

                // Kill it hard, we don't want CPTP to generate a suboptimal
                // solution in its JSON output
                kill(p->pid, SIGTERM);
            }

            int exit_status = 0;
            if (proc_terminated(p->pid, &exit_status)) {
                printf("Process %d %s [status=%d]: ", p->pid,
                       exit_status == 0 ? "exited correctly" : "failed",
                       exit_status);
                printf("(CMD");

                for (int32_t i = 0; i < PROC_MAX_ARGS - 1 && p->args[i] != NULL;
                     i++) {
                    printf(" %s", p->args[i]);
                }
                printf(")\n");
                if (pool->on_async_proc_exit) {
                    pool->on_async_proc_exit(p, exit_status, p->user_handle);
                }
                proc_destroy(p);
                return idx;
            }
        }
        usleep(PROC_POOL_UPDATE_PERIOD_MSEC * 1000);
    } while (any_valid);

    return INT32_MIN;
}